

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_comp.cpp
# Opt level: O3

bool __thiscall
basisu::basis_compressor::write_output_files_and_compute_stats(basis_compressor *this)

{
  vector<basisu::image_stats> *this_00;
  image *piVar1;
  gpu_image *pgVar2;
  basisu_backend_slice_desc *pbVar3;
  undefined8 uVar4;
  long lVar5;
  bool bVar6;
  mz_bool mVar7;
  int iVar8;
  int iVar9;
  undefined8 *puVar10;
  void *__s1;
  uint uVar11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  ulong uVar13;
  char *__function;
  size_t len;
  long lVar14;
  uint uVar15;
  uint8_t *pData;
  char cVar16;
  undefined8 uVar17;
  pointer pcVar18;
  image_stats *piVar19;
  ulong uVar20;
  uint uVar21;
  long lVar22;
  void *pvVar23;
  ulong uVar24;
  float fVar25;
  size_t decomp_size;
  image best_etc1s_unpacked;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string out_basename;
  undefined1 local_f8 [32];
  elemental_vector local_d8;
  long local_c0;
  _Alloc_hider local_b8;
  uint32_t local_b0;
  undefined4 uStack_ac;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  string local_98;
  basisu_backend_slice_desc *local_78;
  string local_70;
  float local_4c;
  ulong local_48;
  ulong local_40;
  image_stats *local_38;
  
  debug_printf("basis_compressor::write_output_files_and_compute_stats\n");
  uVar20 = (ulong)(this->m_params).m_create_ktx2_file.m_value << 7 | 0x638;
  if ((this->m_params).m_write_output_basis_files.m_value == true) {
    len = (size_t)*(uint *)((long)&(this->m_params).m_source_filenames.m_p + uVar20);
    if (len == 0) {
      pData = "";
      len = 0;
    }
    else {
      pData = *(uint8_t **)(&(this->m_params).m_uastc.m_value + uVar20);
    }
    bVar6 = write_data_to_file((this->m_params).m_out_filename._M_dataplus._M_p,pData,len);
    if (!bVar6) {
      error_printf("Failed writing output data to file \"%s\"\n",
                   (this->m_params).m_out_filename._M_dataplus._M_p);
      return false;
    }
    if ((this->m_params).m_status_output.m_value == true) {
      printf("Wrote output .basis/.ktx2 file \"%s\"\n");
    }
  }
  if ((((this->m_params).m_compute_stats.m_value == true) &&
      ((this->m_params).m_uastc.m_value == true)) &&
     (uVar24 = (ulong)*(uint *)((long)&(this->m_params).m_source_filenames.m_p + uVar20),
     uVar24 != 0)) {
    local_f8._16_8_ = (void *)0x0;
    local_f8._0_4_ = 0.0;
    local_f8._4_4_ = 0.0;
    local_f8._8_4_ = 0.0;
    local_f8._12_4_ = 0.0;
    local_f8._24_8_ = 1;
    mVar7 = buminiz::tdefl_compress_mem_to_output
                      (*(void **)(&(this->m_params).m_uastc.m_value + uVar20),uVar24,
                       buminiz::tdefl_output_buffer_putter,local_f8,0xfff);
    uVar24 = 0;
    if (mVar7 == 0) {
      pvVar23 = (void *)0x0;
    }
    else {
      uVar24 = CONCAT44(local_f8._4_4_,local_f8._0_4_);
      pvVar23 = (void *)local_f8._16_8_;
    }
    local_f8._0_4_ = 0.0;
    local_f8._4_4_ = 0.0;
    __s1 = buminiz::tinfl_decompress_mem_to_heap(pvVar23,uVar24,(size_t *)local_f8,0);
    uVar15 = *(uint *)((long)&(this->m_params).m_source_filenames.m_p + uVar20);
    if (CONCAT44(local_f8._4_4_,local_f8._0_4_) == (ulong)uVar15) {
      if (uVar15 == 0) {
        __assert_fail("i < m_size",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/../transcoder/basisu_containers.h"
                      ,0x177,
                      "const T &basisu::vector<unsigned char>::operator[](size_t) const [T = unsigned char]"
                     );
      }
      iVar9 = bcmp(__s1,*(void **)(&(this->m_params).m_uastc.m_value + uVar20),
                   CONCAT44(local_f8._4_4_,local_f8._0_4_));
      if (iVar9 == 0) {
        free(pvVar23);
        free(__s1);
        uVar13 = (ulong)(this->m_slice_descs).m_size;
        if (uVar13 == 0) {
          fVar25 = 0.0;
        }
        else {
          pbVar3 = (this->m_slice_descs).m_p;
          lVar14 = 0;
          uVar15 = 0;
          do {
            uVar15 = uVar15 + *(int *)((long)&pbVar3->m_num_blocks_x + lVar14) *
                              *(int *)((long)&pbVar3->m_num_blocks_y + lVar14) * 0x10;
            lVar14 = lVar14 + 0x30;
          } while (uVar13 * 0x30 != lVar14);
          fVar25 = (float)uVar15;
        }
        this->m_basis_bits_per_texel = (double)(((float)uVar24 * 8.0) / fVar25);
        debug_printf(".basis file size: %u, LZ compressed file size: %u, %3.2f bits/texel\n",
                     (ulong)*(uint *)((long)&(this->m_params).m_source_filenames.m_p + uVar20),
                     uVar24 & 0xffffffff);
        goto LAB_0021731d;
      }
    }
    puts(
        "basis_compressor::create_basis_file_and_transcode:: miniz compression or decompression failed!"
        );
    bVar6 = false;
  }
  else {
    uVar24 = 0;
LAB_0021731d:
    this_00 = &this->m_stats;
    uVar15 = (this->m_stats).m_size;
    uVar21 = (this->m_slice_descs).m_size;
    uVar11 = uVar15 - uVar21;
    local_40 = uVar24;
    if (uVar11 != 0) {
      if (uVar15 < uVar21 || uVar11 == 0) {
        if ((this->m_stats).m_capacity < uVar21) {
          elemental_vector::increase_capacity
                    ((elemental_vector *)this_00,uVar21,uVar15 + 1 == uVar21,0x68,
                     vector<basisu::image_stats>::object_mover,false);
          uVar15 = (this->m_stats).m_size;
        }
        if (uVar21 - uVar15 != 0) {
          lVar14 = (ulong)(uVar21 - uVar15) * 0x68;
          paVar12 = &this_00->m_p[uVar15].m_filename.field_2;
          do {
            *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              **)(paVar12->_M_local_buf + -0x10) = paVar12;
            *(char *)((long)paVar12 + 0x10) = '\0';
            *(char *)((long)paVar12 + 0x11) = '\0';
            *(char *)((long)paVar12 + 0x12) = '\0';
            *(char *)((long)paVar12 + 0x13) = '\0';
            *(char *)((long)paVar12 + 0x14) = '\0';
            *(char *)((long)paVar12 + 0x15) = '\0';
            *(char *)((long)paVar12 + 0x16) = '\0';
            *(char *)((long)paVar12 + 0x17) = '\0';
            *(char *)((long)paVar12 + 0x18) = '\0';
            *(char *)((long)paVar12 + 0x19) = '\0';
            *(char *)((long)paVar12 + 0x1a) = '\0';
            *(char *)((long)paVar12 + 0x1b) = '\0';
            *(char *)((long)paVar12 + 0x1c) = '\0';
            *(char *)((long)paVar12 + 0x1d) = '\0';
            *(char *)((long)paVar12 + 0x1e) = '\0';
            *(char *)((long)paVar12 + 0x1f) = '\0';
            *(char *)((long)paVar12 + 0x20) = '\0';
            *(char *)((long)paVar12 + 0x21) = '\0';
            *(char *)((long)paVar12 + 0x22) = '\0';
            *(char *)((long)paVar12 + 0x23) = '\0';
            *(char *)((long)paVar12 + 0x24) = '\0';
            *(char *)((long)paVar12 + 0x25) = '\0';
            *(char *)((long)paVar12 + 0x26) = '\0';
            *(char *)((long)paVar12 + 0x27) = '\0';
            *(char *)((long)paVar12 + 0x28) = '\0';
            *(char *)((long)paVar12 + 0x29) = '\0';
            *(char *)((long)paVar12 + 0x2a) = '\0';
            *(char *)((long)paVar12 + 0x2b) = '\0';
            *(char *)((long)paVar12 + 0x2c) = '\0';
            *(char *)((long)paVar12 + 0x2d) = '\0';
            *(char *)((long)paVar12 + 0x2e) = '\0';
            *(char *)((long)paVar12 + 0x2f) = '\0';
            *(char *)((long)paVar12 + 0x30) = '\0';
            *(char *)((long)paVar12 + 0x31) = '\0';
            *(char *)((long)paVar12 + 0x32) = '\0';
            *(char *)((long)paVar12 + 0x33) = '\0';
            *(char *)((long)paVar12 + 0x34) = '\0';
            *(char *)((long)paVar12 + 0x35) = '\0';
            *(char *)((long)paVar12 + 0x36) = '\0';
            *(char *)((long)paVar12 + 0x37) = '\0';
            *(char *)((long)paVar12 + 0x38) = '\0';
            *(char *)((long)paVar12 + 0x39) = '\0';
            *(char *)((long)paVar12 + 0x3a) = '\0';
            *(char *)((long)paVar12 + 0x3b) = '\0';
            *(char *)((long)paVar12 + 0x3c) = '\0';
            *(char *)((long)paVar12 + 0x3d) = '\0';
            *(char *)((long)paVar12 + 0x3e) = '\0';
            *(char *)((long)paVar12 + 0x3f) = '\0';
            *(char *)((long)paVar12 + 0x40) = '\0';
            *(char *)((long)paVar12 + 0x41) = '\0';
            *(char *)((long)paVar12 + 0x42) = '\0';
            *(char *)((long)paVar12 + 0x43) = '\0';
            *(char *)((long)paVar12 + 0x44) = '\0';
            *(char *)((long)paVar12 + 0x45) = '\0';
            *(char *)((long)paVar12 + 0x46) = '\0';
            *(char *)((long)paVar12 + 0x47) = '\0';
            *(char *)((long)paVar12 + 0x48) = '\0';
            *(char *)((long)paVar12 + 0x49) = '\0';
            *(char *)((long)paVar12 + 0x4a) = '\0';
            *(char *)((long)paVar12 + 0x4b) = '\0';
            *(char *)((long)paVar12 + 0x4c) = '\0';
            *(char *)((long)paVar12 + 0x4d) = '\0';
            *(char *)((long)paVar12 + 0x4e) = '\0';
            *(char *)((long)paVar12 + 0x4f) = '\0';
            *(char *)((long)paVar12 + 0x50) = '\0';
            *(char *)((long)paVar12 + 0x51) = '\0';
            *(char *)((long)paVar12 + 0x52) = '\0';
            *(char *)((long)paVar12 + 0x53) = '\0';
            *(char *)((long)paVar12 + 0x54) = '\0';
            *(char *)((long)paVar12 + 0x55) = '\0';
            *(char *)((long)paVar12 + 0x56) = '\0';
            *(char *)((long)paVar12 + 0x57) = '\0';
            *(char *)((long)paVar12 + -8) = '\0';
            *(char *)((long)paVar12 + -7) = '\0';
            *(char *)((long)paVar12 + -6) = '\0';
            *(char *)((long)paVar12 + -5) = '\0';
            *(char *)((long)paVar12 + -4) = '\0';
            *(char *)((long)paVar12 + -3) = '\0';
            *(char *)((long)paVar12 + -2) = '\0';
            *(char *)((long)paVar12 + -1) = '\0';
            paVar12->_M_local_buf[0] = '\0';
            paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(paVar12->_M_local_buf + 0x68);
            lVar14 = lVar14 + -0x68;
          } while (lVar14 != 0);
        }
      }
      else {
        lVar14 = (ulong)uVar11 * 0x68;
        paVar12 = &this_00->m_p[uVar21].m_filename.field_2;
        do {
          if (paVar12 !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(&paVar12->_M_allocated_capacity)[-2]) {
            operator_delete((long *)(&paVar12->_M_allocated_capacity)[-2],
                            paVar12->_M_allocated_capacity + 1);
          }
          paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(&paVar12->_M_allocated_capacity + 0xd);
          lVar14 = lVar14 + -0x68;
        } while (lVar14 != 0);
      }
      (this->m_stats).m_size = uVar21;
      uVar21 = (this->m_slice_descs).m_size;
    }
    bVar6 = true;
    if (((this->m_params).m_validate_output_data.m_value == true) && (uVar21 != 0)) {
      local_c0 = 0x28;
      lVar22 = 0;
      lVar14 = 0;
      uVar24 = 0;
      local_48 = uVar20;
      do {
        local_78 = (this->m_slice_descs).m_p;
        if ((this->m_params).m_compute_stats.m_value == true) {
          printf("Slice: %u\n",uVar24 & 0xffffffff);
          if ((this->m_stats).m_size <= uVar24) {
            __function = 
            "T &basisu::vector<basisu::image_stats>::operator[](size_t) [T = basisu::image_stats]";
            goto LAB_00218a74;
          }
          piVar19 = (this->m_stats).m_p;
          local_f8._0_4_ = 0.0;
          local_f8._4_4_ = 0.0;
          local_f8._8_4_ = 0.0;
          local_f8._12_4_ = 0.0;
          local_f8._16_8_ = (void *)0x0;
          if ((uVar24 < (this->m_slice_images).m_size) &&
             (uVar24 < (this->m_decoded_output_textures_unpacked).m_size)) {
            image_metrics::calc((image_metrics *)local_f8,
                                (image *)((long)&((this->m_slice_images).m_p)->m_width + lVar22),
                                (image *)((long)&((this->m_decoded_output_textures_unpacked).m_p)->
                                                 m_width + lVar22),0,3,true,false);
            printf("%sMax: %3.0f Mean: %3.3f RMS: %3.3f PSNR: %2.3f dB\n",
                   SUB84((double)(float)local_f8._0_4_,0),SUB84((double)(float)local_f8._4_4_,0),
                   (double)(float)local_f8._12_4_,(double)(float)local_f8._16_4_,
                   ".basis RGB Avg:          ");
            *(undefined4 *)((long)&(piVar19->m_filename)._M_dataplus._M_p + local_c0) =
                 local_f8._16_4_;
            if ((uVar24 < (this->m_slice_images).m_size) &&
               (uVar24 < (this->m_decoded_output_textures_unpacked).m_size)) {
              image_metrics::calc((image_metrics *)local_f8,
                                  (image *)((long)&((this->m_slice_images).m_p)->m_width + lVar22),
                                  (image *)((long)&((this->m_decoded_output_textures_unpacked).m_p)
                                                   ->m_width + lVar22),0,4,true,false);
              printf("%sMax: %3.0f Mean: %3.3f RMS: %3.3f PSNR: %2.3f dB\n",
                     SUB84((double)(float)local_f8._0_4_,0),SUB84((double)(float)local_f8._4_4_,0),
                     (double)(float)local_f8._12_4_,(double)(float)local_f8._16_4_,
                     ".basis RGBA Avg:         ");
              *(undefined4 *)((long)&(piVar19->m_filename)._M_dataplus._M_p + local_c0 + 4) =
                   local_f8._16_4_;
              if ((uVar24 < (this->m_slice_images).m_size) &&
                 (uVar24 < (this->m_decoded_output_textures_unpacked).m_size)) {
                image_metrics::calc((image_metrics *)local_f8,
                                    (image *)((long)&((this->m_slice_images).m_p)->m_width + lVar22)
                                    ,(image *)((long)&((this->m_decoded_output_textures_unpacked).
                                                      m_p)->m_width + lVar22),0,1,true,false);
                printf("%sMax: %3.0f Mean: %3.3f RMS: %3.3f PSNR: %2.3f dB\n",
                       SUB84((double)(float)local_f8._0_4_,0),SUB84((double)(float)local_f8._4_4_,0)
                       ,(double)(float)local_f8._12_4_,(double)(float)local_f8._16_4_,
                       ".basis R   Avg:          ");
                if ((uVar24 < (this->m_slice_images).m_size) &&
                   (uVar24 < (this->m_decoded_output_textures_unpacked).m_size)) {
                  image_metrics::calc((image_metrics *)local_f8,
                                      (image *)((long)&((this->m_slice_images).m_p)->m_width +
                                               lVar22),
                                      (image *)((long)&((this->m_decoded_output_textures_unpacked).
                                                       m_p)->m_width + lVar22),1,1,true,false);
                  printf("%sMax: %3.0f Mean: %3.3f RMS: %3.3f PSNR: %2.3f dB\n",
                         SUB84((double)(float)local_f8._0_4_,0),
                         SUB84((double)(float)local_f8._4_4_,0),(double)(float)local_f8._12_4_,
                         (double)(float)local_f8._16_4_,".basis G   Avg:          ");
                  if ((uVar24 < (this->m_slice_images).m_size) &&
                     (uVar24 < (this->m_decoded_output_textures_unpacked).m_size)) {
                    image_metrics::calc((image_metrics *)local_f8,
                                        (image *)((long)&((this->m_slice_images).m_p)->m_width +
                                                 lVar22),
                                        (image *)((long)&((this->m_decoded_output_textures_unpacked)
                                                         .m_p)->m_width + lVar22),2,1,true,false);
                    printf("%sMax: %3.0f Mean: %3.3f RMS: %3.3f PSNR: %2.3f dB\n",
                           SUB84((double)(float)local_f8._0_4_,0),
                           SUB84((double)(float)local_f8._4_4_,0),(double)(float)local_f8._12_4_,
                           (double)(float)local_f8._16_4_,".basis B   Avg:          ");
                    if ((this->m_params).m_uastc.m_value == true) {
                      if (((this->m_slice_images).m_size <= uVar24) ||
                         ((this->m_decoded_output_textures_unpacked).m_size <= uVar24))
                      goto LAB_00218a5f;
                      image_metrics::calc((image_metrics *)local_f8,
                                          (image *)((long)&((this->m_slice_images).m_p)->m_width +
                                                   lVar22),
                                          (image *)((long)&((this->
                                                  m_decoded_output_textures_unpacked).m_p)->m_width
                                                  + lVar22),3,1,true,false);
                      printf("%sMax: %3.0f Mean: %3.3f RMS: %3.3f PSNR: %2.3f dB\n",
                             SUB84((double)(float)local_f8._0_4_,0),
                             SUB84((double)(float)local_f8._4_4_,0),(double)(float)local_f8._12_4_,
                             (double)(float)local_f8._16_4_,".basis A   Avg:          ");
                      *(undefined4 *)((long)&(piVar19->m_filename)._M_string_length + local_c0) =
                           local_f8._16_4_;
                    }
                    if ((uVar24 < (this->m_slice_images).m_size) &&
                       (uVar24 < (this->m_decoded_output_textures_unpacked).m_size)) {
                      image_metrics::calc((image_metrics *)local_f8,
                                          (image *)((long)&((this->m_slice_images).m_p)->m_width +
                                                   lVar22),
                                          (image *)((long)&((this->
                                                  m_decoded_output_textures_unpacked).m_p)->m_width
                                                  + lVar22),0,0,true,false);
                      printf("%sMax: %3.0f Mean: %3.3f RMS: %3.3f PSNR: %2.3f dB\n",
                             SUB84((double)(float)local_f8._0_4_,0),
                             SUB84((double)(float)local_f8._4_4_,0),(double)(float)local_f8._12_4_,
                             (double)(float)local_f8._16_4_,".basis 709 Luma:         ");
                      *(undefined4 *)((long)&(piVar19->m_filename)._M_string_length + local_c0 + 4)
                           = local_f8._16_4_;
                      *(undefined4 *)((long)&(piVar19->m_filename).field_2 + local_c0 + 4) =
                           local_f8._20_4_;
                      if ((uVar24 < (this->m_slice_images).m_size) &&
                         (uVar24 < (this->m_decoded_output_textures_unpacked).m_size)) {
                        image_metrics::calc((image_metrics *)local_f8,
                                            (image *)((long)&((this->m_slice_images).m_p)->m_width +
                                                     lVar22),
                                            (image *)((long)&((this->
                                                  m_decoded_output_textures_unpacked).m_p)->m_width
                                                  + lVar22),0,0,true,true);
                        printf("%sMax: %3.0f Mean: %3.3f RMS: %3.3f PSNR: %2.3f dB\n",
                               SUB84((double)(float)local_f8._0_4_,0),
                               SUB84((double)(float)local_f8._4_4_,0),(double)(float)local_f8._12_4_
                               ,(double)(float)local_f8._16_4_);
                        pbVar3 = local_78;
                        lVar5 = local_c0;
                        *(undefined4 *)((long)&(piVar19->m_filename).field_2 + local_c0) =
                             local_f8._16_4_;
                        if ((this->m_slice_descs).m_size == 1) {
                          uVar15 = (uint)local_40;
                          if (local_40 == 0) {
                            uVar15 = *(uint *)((long)&(this->m_params).m_source_filenames.m_p +
                                              local_48);
                          }
                          local_4c = (float)uVar15 * 8.0;
                          local_38 = piVar19;
                          debug_printf(".basis RGB PSNR per bit/texel*10000: %3.3f\n",
                                       SUB84((double)((*(float *)((long)&(piVar19->m_filename).
                                                                         _M_dataplus._M_p + local_c0
                                                                 ) * 10000.0) /
                                                     (local_4c /
                                                     (float)(uint)(*(int *)((long)&local_78->
                                                                                   m_orig_height +
                                                                           lVar14) *
                                                                  *(int *)((long)&local_78->
                                                                                  m_orig_width +
                                                                          lVar14)))),0));
                          piVar19 = local_38;
                          debug_printf(".basis Luma 709 PSNR per bit/texel*10000: %3.3f\n",
                                       SUB84((double)((*(float *)((long)&(local_38->m_filename).
                                                                         _M_string_length +
                                                                 lVar5 + 4) * 10000.0) /
                                                     (local_4c /
                                                     (float)(uint)(*(int *)((long)&pbVar3->
                                                  m_orig_height + lVar14) *
                                                  *(int *)((long)&pbVar3->m_orig_width + lVar14)))),
                                             0));
                        }
                        if (uVar24 < (this->m_decoded_output_textures_unpacked_bc7).m_size) {
                          piVar1 = (this->m_decoded_output_textures_unpacked_bc7).m_p;
                          if (*(int *)((long)&piVar1->m_width + lVar22) == 0) {
LAB_00217f24:
                            if ((this->m_params).m_uastc.m_value != false) {
LAB_00218108:
                              goto LAB_00218115;
                            }
                            if ((uVar24 < (this->m_slice_images).m_size) &&
                               (uVar24 < (this->m_best_etc1s_images_unpacked).m_size)) {
                              image_metrics::calc((image_metrics *)local_f8,
                                                  (image *)((long)&((this->m_slice_images).m_p)->
                                                                   m_width + lVar22),
                                                  (image *)((long)&((this->
                                                  m_best_etc1s_images_unpacked).m_p)->m_width +
                                                  lVar22),0,3,true,false);
                              printf("%sMax: %3.0f Mean: %3.3f RMS: %3.3f PSNR: %2.3f dB\n",
                                     SUB84((double)(float)local_f8._0_4_,0),
                                     SUB84((double)(float)local_f8._4_4_,0),
                                     (double)(float)local_f8._12_4_,(double)(float)local_f8._16_4_,
                                     "Unquantized ETC1S RGB Avg:     ");
                              *(undefined4 *)((long)&piVar19->m_basis_a_avg_psnr + local_c0) =
                                   local_f8._16_4_;
                              if ((uVar24 < (this->m_slice_images).m_size) &&
                                 (uVar24 < (this->m_best_etc1s_images_unpacked).m_size)) {
                                image_metrics::calc((image_metrics *)local_f8,
                                                    (image *)((long)&((this->m_slice_images).m_p)->
                                                                     m_width + lVar22),
                                                    (image *)((long)&((this->
                                                  m_best_etc1s_images_unpacked).m_p)->m_width +
                                                  lVar22),0,0,true,false);
                                printf("%sMax: %3.0f Mean: %3.3f RMS: %3.3f PSNR: %2.3f dB\n",
                                       SUB84((double)(float)local_f8._0_4_,0),
                                       SUB84((double)(float)local_f8._4_4_,0),
                                       (double)(float)local_f8._12_4_,(double)(float)local_f8._16_4_
                                       ,"Unquantized ETC1S 709 Luma:    ");
                                *(undefined4 *)((long)&piVar19->m_basis_luma_709_psnr + local_c0) =
                                     local_f8._16_4_;
                                *(undefined4 *)((long)&piVar19->m_basis_luma_709_ssim + local_c0) =
                                     local_f8._20_4_;
                                if ((uVar24 < (this->m_slice_images).m_size) &&
                                   (uVar24 < (this->m_best_etc1s_images_unpacked).m_size)) {
                                  image_metrics::calc((image_metrics *)local_f8,
                                                      (image *)((long)&((this->m_slice_images).m_p)
                                                                       ->m_width + lVar22),
                                                      (image *)((long)&((this->
                                                  m_best_etc1s_images_unpacked).m_p)->m_width +
                                                  lVar22),0,0,true,true);
                                  printf("%sMax: %3.0f Mean: %3.3f RMS: %3.3f PSNR: %2.3f dB\n",
                                         SUB84((double)(float)local_f8._0_4_,0),
                                         SUB84((double)(float)local_f8._4_4_,0),
                                         (double)(float)local_f8._12_4_,
                                         (double)(float)local_f8._16_4_);
                                  *(undefined4 *)((long)&piVar19->m_basis_luma_601_psnr + local_c0)
                                       = local_f8._16_4_;
                                  goto LAB_00218108;
                                }
                              }
                            }
                          }
                          else if (uVar24 < (this->m_slice_images).m_size) {
                            image_metrics::calc((image_metrics *)local_f8,
                                                (image *)((long)&((this->m_slice_images).m_p)->
                                                                 m_width + lVar22),
                                                (image *)((long)&piVar1->m_width + lVar22),0,3,true,
                                                false);
                            printf("%sMax: %3.0f Mean: %3.3f RMS: %3.3f PSNR: %2.3f dB\n",
                                   SUB84((double)(float)local_f8._0_4_,0),
                                   SUB84((double)(float)local_f8._4_4_,0),
                                   (double)(float)local_f8._12_4_,(double)(float)local_f8._16_4_,
                                   "BC7 RGB Avg:             ");
                            *(undefined4 *)((long)&(piVar19->m_filename).field_2 + local_c0 + 8) =
                                 local_f8._16_4_;
                            if ((uVar24 < (this->m_slice_images).m_size) &&
                               (uVar24 < (this->m_decoded_output_textures_unpacked_bc7).m_size)) {
                              image_metrics::calc((image_metrics *)local_f8,
                                                  (image *)((long)&((this->m_slice_images).m_p)->
                                                                   m_width + lVar22),
                                                  (image *)((long)&((this->
                                                  m_decoded_output_textures_unpacked_bc7).m_p)->
                                                  m_width + lVar22),0,4,true,false);
                              printf("%sMax: %3.0f Mean: %3.3f RMS: %3.3f PSNR: %2.3f dB\n",
                                     SUB84((double)(float)local_f8._0_4_,0),
                                     SUB84((double)(float)local_f8._4_4_,0),
                                     (double)(float)local_f8._12_4_,(double)(float)local_f8._16_4_,
                                     "BC7 RGBA Avg:            ");
                              *(undefined4 *)((long)&(piVar19->m_filename).field_2 + local_c0 + 0xc)
                                   = local_f8._16_4_;
                              if ((uVar24 < (this->m_slice_images).m_size) &&
                                 (uVar24 < (this->m_decoded_output_textures_unpacked_bc7).m_size)) {
                                image_metrics::calc((image_metrics *)local_f8,
                                                    (image *)((long)&((this->m_slice_images).m_p)->
                                                                     m_width + lVar22),
                                                    (image *)((long)&((this->
                                                  m_decoded_output_textures_unpacked_bc7).m_p)->
                                                  m_width + lVar22),0,1,true,false);
                                printf("%sMax: %3.0f Mean: %3.3f RMS: %3.3f PSNR: %2.3f dB\n",
                                       SUB84((double)(float)local_f8._0_4_,0),
                                       SUB84((double)(float)local_f8._4_4_,0),
                                       (double)(float)local_f8._12_4_,(double)(float)local_f8._16_4_
                                       ,"BC7 R   Avg:             ");
                                if ((uVar24 < (this->m_slice_images).m_size) &&
                                   (uVar24 < (this->m_decoded_output_textures_unpacked_bc7).m_size))
                                {
                                  image_metrics::calc((image_metrics *)local_f8,
                                                      (image *)((long)&((this->m_slice_images).m_p)
                                                                       ->m_width + lVar22),
                                                      (image *)((long)&((this->
                                                  m_decoded_output_textures_unpacked_bc7).m_p)->
                                                  m_width + lVar22),1,1,true,false);
                                  printf("%sMax: %3.0f Mean: %3.3f RMS: %3.3f PSNR: %2.3f dB\n",
                                         SUB84((double)(float)local_f8._0_4_,0),
                                         SUB84((double)(float)local_f8._4_4_,0),
                                         (double)(float)local_f8._12_4_,
                                         (double)(float)local_f8._16_4_,"BC7 G   Avg:             ")
                                  ;
                                  if ((uVar24 < (this->m_slice_images).m_size) &&
                                     (uVar24 < (this->m_decoded_output_textures_unpacked_bc7).m_size
                                     )) {
                                    image_metrics::calc((image_metrics *)local_f8,
                                                        (image *)((long)&((this->m_slice_images).m_p
                                                                         )->m_width + lVar22),
                                                        (image *)((long)&((this->
                                                  m_decoded_output_textures_unpacked_bc7).m_p)->
                                                  m_width + lVar22),2,1,true,false);
                                    printf("%sMax: %3.0f Mean: %3.3f RMS: %3.3f PSNR: %2.3f dB\n",
                                           SUB84((double)(float)local_f8._0_4_,0),
                                           SUB84((double)(float)local_f8._4_4_,0),
                                           (double)(float)local_f8._12_4_,
                                           (double)(float)local_f8._16_4_,
                                           "BC7 B   Avg:             ");
                                    if ((this->m_params).m_uastc.m_value == true) {
                                      if (((this->m_slice_images).m_size <= uVar24) ||
                                         ((this->m_decoded_output_textures_unpacked_bc7).m_size <=
                                          uVar24)) goto LAB_00218a5f;
                                      image_metrics::calc((image_metrics *)local_f8,
                                                          (image *)((long)&((this->m_slice_images).
                                                                           m_p)->m_width + lVar22),
                                                          (image *)((long)&((this->
                                                  m_decoded_output_textures_unpacked_bc7).m_p)->
                                                  m_width + lVar22),3,1,true,false);
                                      printf("%sMax: %3.0f Mean: %3.3f RMS: %3.3f PSNR: %2.3f dB\n",
                                             SUB84((double)(float)local_f8._0_4_,0),
                                             SUB84((double)(float)local_f8._4_4_,0),
                                             (double)(float)local_f8._12_4_,
                                             (double)(float)local_f8._16_4_,
                                             "BC7 A   Avg:             ");
                                      *(undefined4 *)((long)&piVar19->m_width + local_c0) =
                                           local_f8._16_4_;
                                    }
                                    if ((uVar24 < (this->m_slice_images).m_size) &&
                                       (uVar24 < (this->m_decoded_output_textures_unpacked_bc7).
                                                 m_size)) {
                                      image_metrics::calc((image_metrics *)local_f8,
                                                          (image *)((long)&((this->m_slice_images).
                                                                           m_p)->m_width + lVar22),
                                                          (image *)((long)&((this->
                                                  m_decoded_output_textures_unpacked_bc7).m_p)->
                                                  m_width + lVar22),0,0,true,false);
                                      printf("%sMax: %3.0f Mean: %3.3f RMS: %3.3f PSNR: %2.3f dB\n",
                                             SUB84((double)(float)local_f8._0_4_,0),
                                             SUB84((double)(float)local_f8._4_4_,0),
                                             (double)(float)local_f8._12_4_,
                                             (double)(float)local_f8._16_4_,
                                             "BC7 709 Luma:            ");
                                      *(undefined4 *)((long)&piVar19->m_height + local_c0) =
                                           local_f8._16_4_;
                                      *(undefined4 *)
                                       ((long)&piVar19->m_basis_rgba_avg_psnr + local_c0) =
                                           local_f8._20_4_;
                                      if ((uVar24 < (this->m_slice_images).m_size) &&
                                         (uVar24 < (this->m_decoded_output_textures_unpacked_bc7).
                                                   m_size)) {
                                        image_metrics::calc((image_metrics *)local_f8,
                                                            (image *)((long)&((this->m_slice_images)
                                                                             .m_p)->m_width + lVar22
                                                                     ),
                                                            (image *)((long)&((this->
                                                  m_decoded_output_textures_unpacked_bc7).m_p)->
                                                  m_width + lVar22),0,0,true,true);
                                        printf("%sMax: %3.0f Mean: %3.3f RMS: %3.3f PSNR: %2.3f dB\n"
                                               ,SUB84((double)(float)local_f8._0_4_,0),
                                               SUB84((double)(float)local_f8._4_4_,0),
                                               (double)(float)local_f8._12_4_,
                                               (double)(float)local_f8._16_4_);
                                        *(undefined4 *)
                                         ((long)&piVar19->m_basis_rgb_avg_psnr + local_c0) =
                                             local_f8._16_4_;
                                        goto LAB_00217f24;
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
          goto LAB_00218a5f;
        }
LAB_00218115:
        pcVar18 = local_f8 + 0x10;
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        local_70._M_string_length = 0;
        local_70.field_2._M_local_buf[0] = '\0';
        if ((this->m_params).m_out_filename._M_string_length == 0) {
          uVar15 = (this->m_params).m_source_filenames.m_size;
          if (uVar15 != 0) {
            uVar21 = *(uint *)((long)&local_78->m_source_file_index + lVar14);
            if (uVar15 <= uVar21) {
              __function = 
              "T &basisu::vector<std::basic_string<char>>::operator[](size_t) [T = std::basic_string<char>]"
              ;
              goto LAB_00218a74;
            }
            local_f8._8_4_ = 0.0;
            local_f8._12_4_ = 0.0;
            local_f8._16_8_ = (ulong)(uint7)local_f8._17_7_ << 8;
            local_f8._0_8_ = pcVar18;
            bVar6 = string_split_path((this->m_params).m_source_filenames.m_p[uVar21]._M_dataplus.
                                      _M_p,(string *)0x0,(string *)0x0,&local_70,(string *)local_f8)
            ;
            if (bVar6) {
              std::__cxx11::string::_M_append((char *)&local_70,local_f8._0_8_);
            }
            goto LAB_002181f9;
          }
        }
        else {
          local_f8._8_4_ = 0.0;
          local_f8._12_4_ = 0.0;
          local_f8._16_8_ = (ulong)(uint7)local_f8._17_7_ << 8;
          local_f8._0_8_ = pcVar18;
          bVar6 = string_split_path((this->m_params).m_out_filename._M_dataplus._M_p,(string *)0x0,
                                    (string *)0x0,&local_70,(string *)local_f8);
          if (bVar6) {
            std::__cxx11::string::_M_append((char *)&local_70,local_f8._0_8_);
          }
LAB_002181f9:
          if ((pointer)local_f8._0_8_ != pcVar18) {
            operator_delete((void *)local_f8._0_8_,local_f8._16_8_ + 1);
          }
        }
        cVar16 = (char)&local_70;
        iVar9 = std::__cxx11::string::rfind(cVar16,0x2f);
        iVar8 = std::__cxx11::string::rfind(cVar16,0x2e);
        if (-1 < iVar8 && iVar9 <= iVar8) {
          std::__cxx11::string::resize((ulong)&local_70,(char)iVar8);
        }
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_b8,"basis_debug_",&local_70);
        string_format_abi_cxx11_(&local_98,"_slice_%u",uVar24 & 0xffffffff);
        uVar17 = (void *)0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_p != &local_a8) {
          uVar17 = local_a8._M_allocated_capacity;
        }
        pvVar23 = (void *)(local_98._M_string_length + CONCAT44(uStack_ac,local_b0));
        if ((ulong)uVar17 < pvVar23) {
          uVar17 = (void *)0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._M_dataplus._M_p != &local_98.field_2) {
            uVar17 = local_98.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar17 < pvVar23) goto LAB_002182eb;
          puVar10 = (undefined8 *)
                    std::__cxx11::string::replace
                              ((ulong)&local_98,0,(char *)0x0,(ulong)local_b8._M_p);
        }
        else {
LAB_002182eb:
          puVar10 = (undefined8 *)
                    std::__cxx11::string::_M_append
                              ((char *)&local_b8,(ulong)local_98._M_dataplus._M_p);
        }
        pcVar18 = (pointer)(puVar10 + 2);
        if ((pointer)*puVar10 == pcVar18) {
          local_f8._16_8_ = *(undefined8 *)pcVar18;
          local_f8._24_8_ = puVar10[3];
          local_f8._0_8_ = local_f8 + 0x10;
        }
        else {
          local_f8._16_8_ = *(undefined8 *)pcVar18;
          local_f8._0_8_ = (pointer)*puVar10;
        }
        local_f8._8_4_ = (undefined4)puVar10[1];
        local_f8._12_4_ = (undefined4)((ulong)puVar10[1] >> 0x20);
        *puVar10 = pcVar18;
        puVar10[1] = 0;
        *pcVar18 = '\0';
        std::__cxx11::string::operator=((string *)&local_70,(string *)local_f8);
        if ((undefined1 *)local_f8._0_8_ != local_f8 + 0x10) {
          operator_delete((void *)local_f8._0_8_,local_f8._16_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != &local_98.field_2) {
          operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_p != &local_a8) {
          operator_delete(local_b8._M_p,local_a8._M_allocated_capacity + 1);
        }
        if (((this->m_params).m_uastc.m_value == false) &&
           ((this->m_frontend).m_params.m_debug_images == true)) {
          if (uVar24 < (this->m_best_etc1s_images).m_size) {
            pgVar2 = (this->m_best_etc1s_images).m_p;
            puVar10 = (undefined8 *)((long)&pgVar2->m_fmt + lVar14);
            uVar17 = *puVar10;
            uVar4 = puVar10[1];
            puVar10 = (undefined8 *)((long)&pgVar2->m_blocks_y + lVar14);
            local_f8._16_8_ = *puVar10;
            local_f8._24_8_ = puVar10[1];
            local_f8._0_4_ = (undefined4)uVar17;
            local_f8._4_4_ = (undefined4)((ulong)uVar17 >> 0x20);
            local_f8._8_4_ = (undefined4)uVar4;
            local_f8._12_4_ = (undefined4)((ulong)uVar4 >> 0x20);
            local_d8.m_p = (unsigned_long *)0x0;
            local_d8.m_size = 0;
            local_d8.m_capacity = 0;
            elemental_vector::increase_capacity
                      (&local_d8,*(uint32_t *)((long)&(pgVar2->m_blocks).m_size + lVar14),false,8,
                       (object_mover)0x0,false);
            uVar15 = *(uint *)((long)&(pgVar2->m_blocks).m_size + lVar14);
            local_d8.m_size = uVar15;
            if (((unsigned_long *)local_d8.m_p != (unsigned_long *)0x0) &&
               (pvVar23 = *(void **)((long)&(pgVar2->m_blocks).m_p + lVar14), pvVar23 != (void *)0x0
               )) {
              memcpy(local_d8.m_p,pvVar23,(ulong)uVar15 << 3);
            }
            uVar17 = *(undefined8 *)((long)&local_78->m_orig_width + lVar14);
            local_f8._4_4_ = (undefined4)uVar17;
            local_f8._8_4_ = (undefined4)((ulong)uVar17 >> 0x20);
            local_b8._M_p = (pointer)&local_a8;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_b8,local_70._M_dataplus._M_p,
                       local_70._M_dataplus._M_p + local_70._M_string_length);
            std::__cxx11::string::append((char *)&local_b8);
            write_compressed_texture_file(local_b8._M_p,(gpu_image *)local_f8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b8._M_p != &local_a8) {
              operator_delete(local_b8._M_p,local_a8._M_allocated_capacity + 1);
            }
            local_b8._M_p = (pointer)0x0;
            local_b0 = 0;
            local_a8._M_allocated_capacity = 0;
            local_a8._8_8_ = 0;
            gpu_image::unpack((gpu_image *)local_f8,(image *)&local_b8);
            local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_98,local_70._M_dataplus._M_p,
                       local_70._M_dataplus._M_p + local_70._M_string_length);
            std::__cxx11::string::append((char *)&local_98);
            save_png(local_98._M_dataplus._M_p,(image *)&local_b8,0,0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_98._M_dataplus._M_p != &local_98.field_2) {
              operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
            }
            if ((void *)local_a8._M_allocated_capacity != (void *)0x0) {
              free((void *)local_a8._M_allocated_capacity);
            }
            if ((unsigned_long *)local_d8.m_p != (unsigned_long *)0x0) {
              free(local_d8.m_p);
            }
            goto LAB_0021855f;
          }
LAB_00218a7e:
          __function = 
          "T &basisu::vector<basisu::gpu_image>::operator[](size_t) [T = basisu::gpu_image]";
LAB_00218a74:
          __assert_fail("i < m_size",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/../transcoder/basisu_containers.h"
                        ,0x178,__function);
        }
LAB_0021855f:
        if ((this->m_params).m_debug_images.m_value != true) goto LAB_002188f1;
        if ((this->m_decoded_output_textures).m_size <= uVar24) goto LAB_00218a7e;
        pgVar2 = (this->m_decoded_output_textures).m_p;
        puVar10 = (undefined8 *)((long)&pgVar2->m_fmt + lVar14);
        uVar17 = *puVar10;
        uVar4 = puVar10[1];
        puVar10 = (undefined8 *)((long)&pgVar2->m_blocks_y + lVar14);
        local_f8._16_8_ = *puVar10;
        local_f8._24_8_ = puVar10[1];
        local_f8._0_4_ = (undefined4)uVar17;
        local_f8._4_4_ = (undefined4)((ulong)uVar17 >> 0x20);
        local_f8._8_4_ = (undefined4)uVar4;
        local_f8._12_4_ = (undefined4)((ulong)uVar4 >> 0x20);
        local_d8.m_p = (unsigned_long *)0x0;
        local_d8.m_size = 0;
        local_d8.m_capacity = 0;
        elemental_vector::increase_capacity
                  (&local_d8,*(uint32_t *)((long)&(pgVar2->m_blocks).m_size + lVar14),false,8,
                   (object_mover)0x0,false);
        uVar15 = *(uint *)((long)&(pgVar2->m_blocks).m_size + lVar14);
        local_d8.m_size = uVar15;
        if (((unsigned_long *)local_d8.m_p != (unsigned_long *)0x0) &&
           (pvVar23 = *(void **)((long)&(pgVar2->m_blocks).m_p + lVar14), pvVar23 != (void *)0x0)) {
          memcpy(local_d8.m_p,pvVar23,(ulong)uVar15 << 3);
        }
        uVar17 = *(undefined8 *)((long)&local_78->m_orig_width + lVar14);
        local_f8._4_4_ = (undefined4)uVar17;
        local_f8._8_4_ = (undefined4)((ulong)uVar17 >> 0x20);
        local_b8._M_p = (pointer)&local_a8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_b8,local_70._M_dataplus._M_p,
                   local_70._M_dataplus._M_p + local_70._M_string_length);
        std::__cxx11::string::append((char *)&local_b8);
        write_compressed_texture_file(local_b8._M_p,(gpu_image *)local_f8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_p != &local_a8) {
          operator_delete(local_b8._M_p,local_a8._M_allocated_capacity + 1);
        }
        if ((this->m_decoded_output_textures_unpacked).m_size <= uVar24) {
LAB_00218a5f:
          __function = "T &basisu::vector<basisu::image>::operator[](size_t) [T = basisu::image]";
          goto LAB_00218a74;
        }
        image::image((image *)&local_b8,
                     (image *)((long)&((this->m_decoded_output_textures_unpacked).m_p)->m_width +
                              lVar22));
        image::crop((image *)&local_b8,*(uint32_t *)((long)&local_78->m_orig_width + lVar14),
                    *(uint32_t *)((long)&local_78->m_orig_height + lVar14),0xffffffff,
                    (color_rgba *)&g_black_color,true);
        local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_98,local_70._M_dataplus._M_p,
                   local_70._M_dataplus._M_p + local_70._M_string_length);
        std::__cxx11::string::append((char *)&local_98);
        save_png(local_98._M_dataplus._M_p,(image *)&local_b8,0,0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != &local_98.field_2) {
          operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
        }
        if ((void *)local_a8._M_allocated_capacity != (void *)0x0) {
          free((void *)local_a8._M_allocated_capacity);
        }
        if ((unsigned_long *)local_d8.m_p != (unsigned_long *)0x0) {
          free(local_d8.m_p);
        }
        if ((this->m_decoded_output_textures_bc7).m_size <= uVar24) goto LAB_00218a7e;
        pgVar2 = (this->m_decoded_output_textures_bc7).m_p;
        if (*(int *)((long)&pgVar2->m_width + lVar14) != 0) {
          puVar10 = (undefined8 *)((long)&pgVar2->m_fmt + lVar14);
          local_f8._16_8_ = puVar10[2];
          local_f8._24_8_ = puVar10[3];
          local_f8._0_4_ = (undefined4)*puVar10;
          local_f8._4_4_ = (undefined4)((ulong)*puVar10 >> 0x20);
          local_f8._8_4_ = (undefined4)puVar10[1];
          local_f8._12_4_ = (undefined4)((ulong)puVar10[1] >> 0x20);
          local_d8.m_p = (unsigned_long *)0x0;
          local_d8.m_size = 0;
          local_d8.m_capacity = 0;
          elemental_vector::increase_capacity
                    (&local_d8,*(uint32_t *)((long)&(pgVar2->m_blocks).m_size + lVar14),false,8,
                     (object_mover)0x0,false);
          uVar15 = *(uint *)((long)&(pgVar2->m_blocks).m_size + lVar14);
          local_d8.m_size = uVar15;
          if (((unsigned_long *)local_d8.m_p != (unsigned_long *)0x0) &&
             (pvVar23 = *(void **)((long)&(pgVar2->m_blocks).m_p + lVar14), pvVar23 != (void *)0x0))
          {
            memcpy(local_d8.m_p,pvVar23,(ulong)uVar15 << 3);
          }
          uVar17 = *(undefined8 *)((long)&local_78->m_orig_width + lVar14);
          local_f8._4_4_ = (undefined4)uVar17;
          local_f8._8_4_ = (undefined4)((ulong)uVar17 >> 0x20);
          local_b8._M_p = (pointer)&local_a8;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_b8,local_70._M_dataplus._M_p,
                     local_70._M_dataplus._M_p + local_70._M_string_length);
          std::__cxx11::string::append((char *)&local_b8);
          write_compressed_texture_file(local_b8._M_p,(gpu_image *)local_f8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._M_p != &local_a8) {
            operator_delete(local_b8._M_p,local_a8._M_allocated_capacity + 1);
          }
          if ((this->m_decoded_output_textures_unpacked_bc7).m_size <= uVar24) goto LAB_00218a5f;
          image::image((image *)&local_b8,
                       (image *)((long)&((this->m_decoded_output_textures_unpacked_bc7).m_p)->
                                        m_width + lVar22));
          image::crop((image *)&local_b8,*(uint32_t *)((long)&local_78->m_orig_width + lVar14),
                      *(uint32_t *)((long)&local_78->m_orig_height + lVar14),0xffffffff,
                      (color_rgba *)&g_black_color,true);
          local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_98,local_70._M_dataplus._M_p,
                     local_70._M_dataplus._M_p + local_70._M_string_length);
          std::__cxx11::string::append((char *)&local_98);
          save_png(local_98._M_dataplus._M_p,(image *)&local_b8,0,0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._M_dataplus._M_p != &local_98.field_2) {
            operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
          }
          if ((void *)local_a8._M_allocated_capacity != (void *)0x0) {
            free((void *)local_a8._M_allocated_capacity);
          }
          if ((unsigned_long *)local_d8.m_p != (unsigned_long *)0x0) {
            free(local_d8.m_p);
          }
        }
LAB_002188f1:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,
                          CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                                   local_70.field_2._M_local_buf[0]) + 1);
        }
        uVar24 = uVar24 + 1;
        lVar14 = lVar14 + 0x30;
        local_c0 = local_c0 + 0x68;
        lVar22 = lVar22 + 0x20;
      } while (uVar24 < (this->m_slice_descs).m_size);
      bVar6 = true;
    }
  }
  return bVar6;
}

Assistant:

bool basis_compressor::write_output_files_and_compute_stats()
	{
		debug_printf("basis_compressor::write_output_files_and_compute_stats\n");

		const uint8_vec& comp_data = m_params.m_create_ktx2_file ? m_output_ktx2_file : m_basis_file.get_compressed_data();
		if (m_params.m_write_output_basis_files)
		{
			const std::string& output_filename = m_params.m_out_filename;

			if (!write_vec_to_file(output_filename.c_str(), comp_data))
			{
				error_printf("Failed writing output data to file \"%s\"\n", output_filename.c_str());
				return false;
			}

			if (m_params.m_status_output)
			{
				printf("Wrote output .basis/.ktx2 file \"%s\"\n", output_filename.c_str());
			}
		}

		size_t comp_size = 0;
		if ((m_params.m_compute_stats) && (m_params.m_uastc) && (comp_data.size()))
		{
			void* pComp_data = tdefl_compress_mem_to_heap(&comp_data[0], comp_data.size(), &comp_size, TDEFL_MAX_PROBES_MASK);// TDEFL_DEFAULT_MAX_PROBES);
			size_t decomp_size = 0;
			void* pDecomp_data = tinfl_decompress_mem_to_heap(pComp_data, comp_size, &decomp_size, 0);
			if ((decomp_size != comp_data.size()) || (memcmp(pDecomp_data, &comp_data[0], decomp_size) != 0))
			{
				printf("basis_compressor::create_basis_file_and_transcode:: miniz compression or decompression failed!\n");
				return false;
			}

			mz_free(pComp_data);
			mz_free(pDecomp_data);

			uint32_t total_texels = 0;
			for (uint32_t i = 0; i < m_slice_descs.size(); i++)
				total_texels += (m_slice_descs[i].m_num_blocks_x * m_slice_descs[i].m_num_blocks_y) * 16;
			
			m_basis_bits_per_texel = comp_size * 8.0f / total_texels;

			debug_printf(".basis file size: %u, LZ compressed file size: %u, %3.2f bits/texel\n",
				(uint32_t)comp_data.size(),
				(uint32_t)comp_size,
				m_basis_bits_per_texel);
		}

		m_stats.resize(m_slice_descs.size());
		
		if (m_params.m_validate_output_data)
		{
			for (uint32_t slice_index = 0; slice_index < m_slice_descs.size(); slice_index++)
			{
				const basisu_backend_slice_desc& slice_desc = m_slice_descs[slice_index];

				if (m_params.m_compute_stats)
				{
					printf("Slice: %u\n", slice_index);

					image_stats& s = m_stats[slice_index];

					// TODO: We used to output SSIM (during heavy encoder development), but this slowed down compression too much. We'll be adding it back.

					image_metrics em;

					// ---- .basis stats
					em.calc(m_slice_images[slice_index], m_decoded_output_textures_unpacked[slice_index], 0, 3);
					em.print(".basis RGB Avg:          ");
					s.m_basis_rgb_avg_psnr = em.m_psnr;

					em.calc(m_slice_images[slice_index], m_decoded_output_textures_unpacked[slice_index], 0, 4);
					em.print(".basis RGBA Avg:         ");
					s.m_basis_rgba_avg_psnr = em.m_psnr;

					em.calc(m_slice_images[slice_index], m_decoded_output_textures_unpacked[slice_index], 0, 1);
					em.print(".basis R   Avg:          ");

					em.calc(m_slice_images[slice_index], m_decoded_output_textures_unpacked[slice_index], 1, 1);
					em.print(".basis G   Avg:          ");

					em.calc(m_slice_images[slice_index], m_decoded_output_textures_unpacked[slice_index], 2, 1);
					em.print(".basis B   Avg:          ");

					if (m_params.m_uastc)
					{
						em.calc(m_slice_images[slice_index], m_decoded_output_textures_unpacked[slice_index], 3, 1);
						em.print(".basis A   Avg:          ");

						s.m_basis_a_avg_psnr = em.m_psnr;
					}

					em.calc(m_slice_images[slice_index], m_decoded_output_textures_unpacked[slice_index], 0, 0);
					em.print(".basis 709 Luma:         ");
					s.m_basis_luma_709_psnr = static_cast<float>(em.m_psnr);
					s.m_basis_luma_709_ssim = static_cast<float>(em.m_ssim);

					em.calc(m_slice_images[slice_index], m_decoded_output_textures_unpacked[slice_index], 0, 0, true, true);
					em.print(".basis 601 Luma:         ");
					s.m_basis_luma_601_psnr = static_cast<float>(em.m_psnr);

					if (m_slice_descs.size() == 1)
					{
						const uint32_t output_size = comp_size ? (uint32_t)comp_size : (uint32_t)comp_data.size();
						debug_printf(".basis RGB PSNR per bit/texel*10000: %3.3f\n", 10000.0f * s.m_basis_rgb_avg_psnr / ((output_size * 8.0f) / (slice_desc.m_orig_width * slice_desc.m_orig_height)));
						debug_printf(".basis Luma 709 PSNR per bit/texel*10000: %3.3f\n", 10000.0f * s.m_basis_luma_709_psnr / ((output_size * 8.0f) / (slice_desc.m_orig_width * slice_desc.m_orig_height)));
					}

					if (m_decoded_output_textures_unpacked_bc7[slice_index].get_width())
					{
						// ---- BC7 stats
						em.calc(m_slice_images[slice_index], m_decoded_output_textures_unpacked_bc7[slice_index], 0, 3);
						em.print("BC7 RGB Avg:             ");
						s.m_bc7_rgb_avg_psnr = em.m_psnr;

						em.calc(m_slice_images[slice_index], m_decoded_output_textures_unpacked_bc7[slice_index], 0, 4);
						em.print("BC7 RGBA Avg:            ");
						s.m_bc7_rgba_avg_psnr = em.m_psnr;

						em.calc(m_slice_images[slice_index], m_decoded_output_textures_unpacked_bc7[slice_index], 0, 1);
						em.print("BC7 R   Avg:             ");

						em.calc(m_slice_images[slice_index], m_decoded_output_textures_unpacked_bc7[slice_index], 1, 1);
						em.print("BC7 G   Avg:             ");

						em.calc(m_slice_images[slice_index], m_decoded_output_textures_unpacked_bc7[slice_index], 2, 1);
						em.print("BC7 B   Avg:             ");

						if (m_params.m_uastc)
						{
							em.calc(m_slice_images[slice_index], m_decoded_output_textures_unpacked_bc7[slice_index], 3, 1);
							em.print("BC7 A   Avg:             ");

							s.m_bc7_a_avg_psnr = em.m_psnr;
						}

						em.calc(m_slice_images[slice_index], m_decoded_output_textures_unpacked_bc7[slice_index], 0, 0);
						em.print("BC7 709 Luma:            ");
						s.m_bc7_luma_709_psnr = static_cast<float>(em.m_psnr);
						s.m_bc7_luma_709_ssim = static_cast<float>(em.m_ssim);

						em.calc(m_slice_images[slice_index], m_decoded_output_textures_unpacked_bc7[slice_index], 0, 0, true, true);
						em.print("BC7 601 Luma:            ");
						s.m_bc7_luma_601_psnr = static_cast<float>(em.m_psnr);
					}

					if (!m_params.m_uastc)
					{
						// ---- Nearly best possible ETC1S stats
						em.calc(m_slice_images[slice_index], m_best_etc1s_images_unpacked[slice_index], 0, 3);
						em.print("Unquantized ETC1S RGB Avg:     ");
						s.m_best_etc1s_rgb_avg_psnr = static_cast<float>(em.m_psnr);

						em.calc(m_slice_images[slice_index], m_best_etc1s_images_unpacked[slice_index], 0, 0);
						em.print("Unquantized ETC1S 709 Luma:    ");
						s.m_best_etc1s_luma_709_psnr = static_cast<float>(em.m_psnr);
						s.m_best_etc1s_luma_709_ssim = static_cast<float>(em.m_ssim);

						em.calc(m_slice_images[slice_index], m_best_etc1s_images_unpacked[slice_index], 0, 0, true, true);
						em.print("Unquantized ETC1S 601 Luma:    ");
						s.m_best_etc1s_luma_601_psnr = static_cast<float>(em.m_psnr);
					}
				}

				std::string out_basename;
				if (m_params.m_out_filename.size())
					string_get_filename(m_params.m_out_filename.c_str(), out_basename);
				else if (m_params.m_source_filenames.size())
					string_get_filename(m_params.m_source_filenames[slice_desc.m_source_file_index].c_str(), out_basename);

				string_remove_extension(out_basename);
				out_basename = "basis_debug_" + out_basename + string_format("_slice_%u", slice_index);

				if ((!m_params.m_uastc) && (m_frontend.get_params().m_debug_images))
				{
					// Write "best" ETC1S debug images
					if (!m_params.m_uastc)
					{
						gpu_image best_etc1s_gpu_image(m_best_etc1s_images[slice_index]);
						best_etc1s_gpu_image.override_dimensions(slice_desc.m_orig_width, slice_desc.m_orig_height);
						write_compressed_texture_file((out_basename + "_best_etc1s.ktx").c_str(), best_etc1s_gpu_image);

						image best_etc1s_unpacked;
						best_etc1s_gpu_image.unpack(best_etc1s_unpacked);
						save_png(out_basename + "_best_etc1s.png", best_etc1s_unpacked);
					}
				}

				if (m_params.m_debug_images)
				{
					// Write decoded ETC1S/ASTC debug images
					{
						gpu_image decoded_etc1s_or_astc(m_decoded_output_textures[slice_index]);
						decoded_etc1s_or_astc.override_dimensions(slice_desc.m_orig_width, slice_desc.m_orig_height);
						write_compressed_texture_file((out_basename + "_transcoded_etc1s_or_astc.ktx").c_str(), decoded_etc1s_or_astc);

						image temp(m_decoded_output_textures_unpacked[slice_index]);
						temp.crop(slice_desc.m_orig_width, slice_desc.m_orig_height);
						save_png(out_basename + "_transcoded_etc1s_or_astc.png", temp);
					}

					// Write decoded BC7 debug images
					if (m_decoded_output_textures_bc7[slice_index].get_pixel_width())
					{
						gpu_image decoded_bc7(m_decoded_output_textures_bc7[slice_index]);
						decoded_bc7.override_dimensions(slice_desc.m_orig_width, slice_desc.m_orig_height);
						write_compressed_texture_file((out_basename + "_transcoded_bc7.ktx").c_str(), decoded_bc7);

						image temp(m_decoded_output_textures_unpacked_bc7[slice_index]);
						temp.crop(slice_desc.m_orig_width, slice_desc.m_orig_height);
						save_png(out_basename + "_transcoded_bc7.png", temp);
					}
				}
			}
		} // if (m_params.m_validate_output_data)
				
		return true;
	}